

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_panel_layout(nk_context *ctx,nk_window *win,float height,int cols)

{
  nk_color c;
  nk_panel *pnVar1;
  nk_vec2 nVar2;
  nk_rect rect;
  float local_58;
  nk_rect background;
  nk_color color;
  nk_vec2 item_spacing;
  nk_command_buffer *out;
  nk_style *style;
  nk_panel *layout;
  int cols_local;
  float height_local;
  nk_window *win_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4b35,
                  "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)")
    ;
  }
  if (ctx->current == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4b36,
                  "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)")
    ;
  }
  if (ctx->current->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4b37,
                  "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)")
    ;
  }
  if (((ctx != (nk_context *)0x0) && (ctx->current != (nk_window *)0x0)) &&
     (ctx->current->layout != (nk_panel *)0x0)) {
    pnVar1 = win->layout;
    c = (ctx->style).window.background;
    nVar2 = (ctx->style).window.spacing;
    if ((pnVar1->flags & 0x8000) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_MINIMIZED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4b47,
                    "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)"
                   );
    }
    if ((pnVar1->flags & 0x2000) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_HIDDEN)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4b48,
                    "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)"
                   );
    }
    if ((pnVar1->flags & 0x4000) != 0) {
      __assert_fail("!(layout->flags & NK_WINDOW_CLOSED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                    ,0x4b49,
                    "void nk_panel_layout(const struct nk_context *, struct nk_window *, float, int)"
                   );
    }
    (pnVar1->row).index = 0;
    pnVar1->at_y = (pnVar1->row).height + pnVar1->at_y;
    (pnVar1->row).columns = cols;
    color = (nk_color)nVar2.y;
    if ((height != 0.0) || (NAN(height))) {
      (pnVar1->row).height = height + (float)color;
    }
    else {
      local_58 = height;
      if (height < (pnVar1->row).min_height) {
        local_58 = (pnVar1->row).min_height;
      }
      (pnVar1->row).height = local_58 + (float)color;
    }
    (pnVar1->row).item_offset = 0.0;
    if ((pnVar1->flags & 0x800) != 0) {
      rect.y = pnVar1->at_y - 1.0;
      rect.x = (win->bounds).x;
      rect.w = (win->bounds).w;
      rect.h = (pnVar1->row).height + 1.0;
      nk_fill_rect(&win->buffer,rect,0.0,c);
    }
  }
  return;
}

Assistant:

NK_INTERN void
nk_panel_layout(const struct nk_context *ctx, struct nk_window *win,
    float height, int cols)
{
    struct nk_panel *layout;
    const struct nk_style *style;
    struct nk_command_buffer *out;

    struct nk_vec2 item_spacing;
    struct nk_color color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    /* prefetch some configuration data */
    layout = win->layout;
    style = &ctx->style;
    out = &win->buffer;
    color = style->window.background;
    item_spacing = style->window.spacing;

    /*  if one of these triggers you forgot to add an `if` condition around either
        a window, group, popup, combobox or contextual menu `begin` and `end` block.
        Example:
            if (nk_begin(...) {...} nk_end(...); or
            if (nk_group_begin(...) { nk_group_end(...);} */
    NK_ASSERT(!(layout->flags & NK_WINDOW_MINIMIZED));
    NK_ASSERT(!(layout->flags & NK_WINDOW_HIDDEN));
    NK_ASSERT(!(layout->flags & NK_WINDOW_CLOSED));

    /* update the current row and set the current row layout */
    layout->row.index = 0;
    layout->at_y += layout->row.height;
    layout->row.columns = cols;
    if (height == 0.0f)
        layout->row.height = NK_MAX(height, layout->row.min_height) + item_spacing.y;
    else layout->row.height = height + item_spacing.y;

    layout->row.item_offset = 0;
    if (layout->flags & NK_WINDOW_DYNAMIC) {
        /* draw background for dynamic panels */
        struct nk_rect background;
        background.x = win->bounds.x;
        background.w = win->bounds.w;
        background.y = layout->at_y - 1.0f;
        background.h = layout->row.height + 1.0f;
        nk_fill_rect(out, background, 0, color);
    }
}